

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O1

char * VW::are_features_compatible(vw *vw1,vw *vw2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__last1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first2;
  bool bVar1;
  int iVar2;
  pointer __rhs;
  char *pcVar3;
  pointer __lhs;
  
  if (vw1->p->hasher == vw2->p->hasher) {
    iVar2 = bcmp(vw1->spelling_features,vw2->spelling_features,0x100);
    if (iVar2 == 0) {
      iVar2 = bcmp(vw1->affix_features,vw2->affix_features,0x1000);
      if (iVar2 == 0) {
        iVar2 = bcmp(vw1->ngram,vw2->ngram,0x400);
        if (iVar2 == 0) {
          iVar2 = bcmp(vw1->skips,vw2->skips,0x400);
          if (iVar2 == 0) {
            iVar2 = bcmp(vw1->limit,vw2->limit,0x400);
            if (iVar2 == 0) {
              if (vw1->num_bits == vw2->num_bits) {
                if (vw1->permutations == vw2->permutations) {
                  if ((long)(vw1->interactions).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(vw1->interactions).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start ==
                      (long)(vw2->interactions).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(vw2->interactions).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) {
                    if (vw1->ignore_some == vw2->ignore_some) {
                      if ((vw1->ignore_some == false) ||
                         (iVar2 = bcmp(vw1->ignore,vw2->ignore,0x100), iVar2 == 0)) {
                        if (vw1->ignore_some_linear == vw2->ignore_some_linear) {
                          if ((vw1->ignore_some_linear == false) ||
                             (iVar2 = bcmp(vw1->ignore_linear,vw2->ignore_linear,0x100), iVar2 == 0)
                             ) {
                            if (vw1->redefine_some == vw2->redefine_some) {
                              if ((vw1->redefine_some == false) ||
                                 (iVar2 = bcmp(vw1->redefine,vw2->redefine,0x100), iVar2 == 0)) {
                                if (vw1->add_constant == vw2->add_constant) {
                                  __first1 = (vw1->dictionary_path).
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start;
                                  __last1 = (vw1->dictionary_path).
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish;
                                  __first2 = (vw2->dictionary_path).
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start;
                                  if ((long)__last1 - (long)__first1 ==
                                      (long)(vw2->dictionary_path).
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)__first2) {
                                    bVar1 = std::__equal<false>::
                                            equal<std::__cxx11::string*,std::__cxx11::string*>
                                                      (__first1,__last1,__first2);
                                    if (bVar1) {
                                      __lhs = (vw1->interactions).
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start;
                                      if (__lhs == (vw1->interactions).
                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish) {
                                        pcVar3 = (char *)0x0;
                                      }
                                      else {
                                        __rhs = (vw2->interactions).
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start;
                                        pcVar3 = (char *)0x0;
                                        do {
                                          bVar1 = std::operator!=(__lhs,__rhs);
                                          if (bVar1) {
                                            return "interaction mismatch";
                                          }
                                          __lhs = __lhs + 1;
                                          __rhs = __rhs + 1;
                                        } while (__lhs != (vw1->interactions).
                                                                                                                    
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish);
                                      }
                                    }
                                    else {
                                      pcVar3 = "dictionary_path";
                                    }
                                  }
                                  else {
                                    pcVar3 = "dictionary_path size";
                                  }
                                }
                                else {
                                  pcVar3 = "add_constant";
                                }
                              }
                              else {
                                pcVar3 = "redefine";
                              }
                            }
                            else {
                              pcVar3 = "redefine_some";
                            }
                          }
                          else {
                            pcVar3 = "ignore_linear";
                          }
                        }
                        else {
                          pcVar3 = "ignore_some_linear";
                        }
                      }
                      else {
                        pcVar3 = "ignore";
                      }
                    }
                    else {
                      pcVar3 = "ignore_some";
                    }
                  }
                  else {
                    pcVar3 = "interactions size";
                  }
                }
                else {
                  pcVar3 = "permutations";
                }
              }
              else {
                pcVar3 = "num_bits";
              }
            }
            else {
              pcVar3 = "limit";
            }
          }
          else {
            pcVar3 = "skips";
          }
        }
        else {
          pcVar3 = "ngram";
        }
      }
      else {
        pcVar3 = "affix_features";
      }
    }
    else {
      pcVar3 = "spelling_features";
    }
  }
  else {
    pcVar3 = "hasher";
  }
  return pcVar3;
}

Assistant:

const char* are_features_compatible(vw& vw1, vw& vw2)
{
  if (vw1.p->hasher != vw2.p->hasher)
    return "hasher";

  if (!equal(vw1.spelling_features, vw1.spelling_features + (sizeof(vw1.spelling_features) / sizeof(bool)),
          vw2.spelling_features))
    return "spelling_features";

  if (!equal(
          vw1.affix_features, vw1.affix_features + (sizeof(vw1.affix_features) / sizeof(uint32_t)), vw2.affix_features))
    return "affix_features";

  if (!equal(vw1.ngram, vw1.ngram + (sizeof(vw1.ngram) / sizeof(uint32_t)), vw2.ngram))
    return "ngram";

  if (!equal(vw1.skips, vw1.skips + (sizeof(vw1.skips) / sizeof(uint32_t)), vw2.skips))
    return "skips";

  if (!equal(vw1.limit, vw1.limit + (sizeof(vw1.limit) / sizeof(uint32_t)), vw2.limit))
    return "limit";

  if (vw1.num_bits != vw2.num_bits)
    return "num_bits";

  if (vw1.permutations != vw2.permutations)
    return "permutations";

  if (vw1.interactions.size() != vw2.interactions.size())
    return "interactions size";

  if (vw1.ignore_some != vw2.ignore_some)
    return "ignore_some";

  if (vw1.ignore_some && !equal(vw1.ignore, vw1.ignore + (sizeof(vw1.ignore) / sizeof(bool)), vw2.ignore))
    return "ignore";

  if (vw1.ignore_some_linear != vw2.ignore_some_linear)
    return "ignore_some_linear";

  if (vw1.ignore_some_linear &&
      !equal(vw1.ignore_linear, vw1.ignore_linear + (sizeof(vw1.ignore_linear) / sizeof(bool)), vw2.ignore_linear))
    return "ignore_linear";

  if (vw1.redefine_some != vw2.redefine_some)
    return "redefine_some";

  if (vw1.redefine_some &&
      !equal(vw1.redefine, vw1.redefine + (sizeof(vw1.redefine) / sizeof(unsigned char)), vw2.redefine))
    return "redefine";

  if (vw1.add_constant != vw2.add_constant)
    return "add_constant";

  if (vw1.dictionary_path.size() != vw2.dictionary_path.size())
    return "dictionary_path size";

  if (!equal(vw1.dictionary_path.begin(), vw1.dictionary_path.end(), vw2.dictionary_path.begin()))
    return "dictionary_path";

  for (auto i = std::begin(vw1.interactions), j = std::begin(vw2.interactions); i != std::end(vw1.interactions);
       ++i, ++j)
    if (*i != *j)
      return "interaction mismatch";

  return nullptr;
}